

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int error_set_condition(ERROR_HANDLE error,char *condition_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  ERROR_INSTANCE *error_instance;
  
  if (error == (ERROR_HANDLE)0x0) {
    iVar2 = 0x1a1;
  }
  else {
    item_value = amqpvalue_create_symbol(condition_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1a9;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(error->composite_value,0,item_value);
      iVar2 = 0x1af;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int error_set_condition(ERROR_HANDLE error, const char* condition_value)
{
    int result;

    if (error == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error;
        AMQP_VALUE condition_amqp_value = amqpvalue_create_symbol(condition_value);
        if (condition_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(error_instance->composite_value, 0, condition_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(condition_amqp_value);
        }
    }

    return result;
}